

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crossover.cc
# Opt level: O2

void __thiscall
ipx::Crossover::PushDual
          (Crossover *this,Basis *basis,Vector *y,Vector *z,
          vector<int,_std::allocator<int>_> *variables,Vector *x,Info *info)

{
  double *pdVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  Model *pMVar6;
  long lVar7;
  vector<int,_std::allocator<int>_> sign_restrict;
  allocator_type local_59;
  Vector *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_58 = z;
  local_50 = variables;
  pMVar6 = Basis::model(basis);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,
             (long)pMVar6->num_cols_ + (long)pMVar6->num_rows_,&local_59);
  pdVar3 = x->_M_data;
  pdVar4 = (pMVar6->lb_)._M_data;
  pdVar5 = (pMVar6->ub_)._M_data;
  for (lVar7 = 0;
      (long)local_48._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48._M_impl.super__Vector_impl_data._M_start >> 2 != lVar7; lVar7 = lVar7 + 1) {
    dVar2 = pdVar3[lVar7];
    pdVar1 = pdVar5 + lVar7;
    if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
      *(byte *)(local_48._M_impl.super__Vector_impl_data._M_start + lVar7) =
           *(byte *)(local_48._M_impl.super__Vector_impl_data._M_start + lVar7) | 1;
    }
    pdVar1 = pdVar4 + lVar7;
    if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
      *(byte *)(local_48._M_impl.super__Vector_impl_data._M_start + lVar7) =
           *(byte *)(local_48._M_impl.super__Vector_impl_data._M_start + lVar7) | 2;
    }
  }
  PushDual(this,basis,y,local_58,local_50,local_48._M_impl.super__Vector_impl_data._M_start,info);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void Crossover::PushDual(Basis* basis, Vector& y, Vector& z,
                         const std::vector<Int>& variables,
                         const Vector& x, Info* info) {
    const Model& model = basis->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();

    std::vector<int> sign_restrict(n+m);
    for (size_t j = 0; j < sign_restrict.size(); j++) {
        if (x[j] != ub[j]) sign_restrict[j] |= 1;
        if (x[j] != lb[j]) sign_restrict[j] |= 2;
    }
    PushDual(basis, y, z, variables, sign_restrict.data(), info);
}